

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O0

void Abc_NtkDontCareWinSweepLeafTfo(Odc_Man_t *p)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_1c;
  int i;
  Abc_Obj_t *pObj;
  Odc_Man_t *p_local;
  
  Abc_NtkIncrementTravId(p->pNode->pNtk);
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vLeaves), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(p->vLeaves,local_1c);
    Abc_NtkDontCareWinSweepLeafTfo_rec
              (pObj_00,(*(uint *)&p->pNode->field_0x14 >> 0xc) + p->nLevels,p->pNode);
  }
  return;
}

Assistant:

void Abc_NtkDontCareWinSweepLeafTfo( Odc_Man_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
        Abc_NtkDontCareWinSweepLeafTfo_rec( pObj, p->pNode->Level + p->nLevels, p->pNode );
}